

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex_posix.c
# Opt level: O0

int mutex_init(mutex_handle *mutex)

{
  int local_24;
  pthread_cond_t *ppStack_20;
  int ret;
  mutex_priv *priv;
  mutex_handle *mutex_local;
  
  ppStack_20 = (pthread_cond_t *)mutex->priv;
  if (ppStack_20 == (pthread_cond_t *)0x0) {
    ppStack_20 = (pthread_cond_t *)calloc(1,0x60);
    if (ppStack_20 == (pthread_cond_t *)0x0) {
      return -0xc;
    }
    mutex->priv = ppStack_20;
  }
  local_24 = pthread_mutex_init((pthread_mutex_t *)(ppStack_20 + 1),(pthread_mutexattr_t *)0x0);
  if (local_24 == 0) {
    local_24 = pthread_cond_init(ppStack_20,(pthread_condattr_t *)0x0);
    if (local_24 == 0) {
      return 0;
    }
    pthread_mutex_destroy((pthread_mutex_t *)(ppStack_20 + 1));
  }
  local_24 = -local_24;
  free(mutex->priv);
  mutex->priv = (void *)0x0;
  return local_24;
}

Assistant:

int mutex_init(struct mutex_handle *mutex)
{
	struct mutex_priv *priv = mutex->priv;
	int ret;

	if (priv == NULL) {
		priv = calloc(1, sizeof(*priv));
		if (priv == NULL)
			return -ENOMEM;

		mutex->priv = priv;
	}

	ret = pthread_mutex_init(&priv->lock, NULL);
	if (ret != 0) {
		ret = -ret;

		goto mutex_init_exit;
	}

	ret = pthread_cond_init(&priv->cond, NULL);
	if (ret != 0) {
		ret = -ret;

		goto mutex_init_exit_late;
	}

	return 0;

mutex_init_exit_late:
	pthread_mutex_destroy(&priv->lock);

mutex_init_exit:
	free(mutex->priv);
	mutex->priv = NULL;

	return ret;
}